

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.h
# Opt level: O0

bool __thiscall
flagser_parameters::has_zero_filtration_and_no_explicit_output
          (flagser_parameters *this,named_arguments_t *named_arguments)

{
  char *pcVar1;
  size_t sVar2;
  named_arguments_t *in_RSI;
  char *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  char *in_stack_ffffffffffffff28;
  allocator *paVar3;
  string *in_stack_ffffffffffffff30;
  named_arguments_t *in_stack_ffffffffffffff38;
  bool local_b1;
  allocator local_94;
  byte local_93;
  byte local_92;
  allocator local_91;
  string local_90 [32];
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  named_arguments_t *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  std::allocator<char>::allocator();
  local_92 = 0;
  local_93 = 0;
  std::__cxx11::string::string(local_38,"out-format",&local_39);
  pcVar1 = get_argument_or_default
                     (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28)
  ;
  sVar2 = strlen(pcVar1);
  local_b1 = false;
  if (sVar2 == 0) {
    std::allocator<char>::allocator();
    local_92 = 1;
    std::__cxx11::string::string(local_90,"filtration",&local_91);
    local_93 = 1;
    pcVar1 = get_argument_or_default(local_18,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    paVar3 = &local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,pcVar1,paVar3);
    local_b1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                               in_stack_ffffffffffffff18);
  }
  local_1 = local_b1;
  if (sVar2 == 0) {
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_94);
  }
  if ((local_93 & 1) != 0) {
    std::__cxx11::string::~string(local_90);
  }
  if ((local_92 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return (bool)(local_1 & 1);
}

Assistant:

bool has_zero_filtration_and_no_explicit_output(const named_arguments_t& named_arguments) {
		return strlen(get_argument_or_default(named_arguments, "out-format", "")) == 0 &&
		       std::string(get_argument_or_default(named_arguments, "filtration", "zero")) == "zero";
	}